

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

bool __thiscall
QListModeViewBase::dropOn
          (QListModeViewBase *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  QListViewPrivate *this_00;
  QListView *pQVar1;
  QRect QVar2;
  QRect QVar3;
  undefined1 auVar4 [16];
  Representation RVar5;
  Representation RVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  DropIndicatorPosition DVar13;
  QPoint QVar14;
  Representation RVar15;
  int iVar16;
  long in_FS_OFFSET;
  QPoint local_98;
  QAbstractItemModel *pQStack_90;
  QModelIndex local_88;
  undefined1 local_68 [12];
  int iStack_5c;
  QPoint local_58;
  QPoint QStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  long local_38;
  
  QVar3._8_8_ = stack0xffffffffffffffa0;
  QVar3._0_8_ = local_68._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event[0xc] == (QDropEvent)0x0) {
    local_58.xp.m_i = -1;
    local_58.yp.m_i = -1;
    QStack_50.xp.m_i = 0;
    QStack_50.yp.m_i = 0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
    local_88._0_16_ =
         QWidget::rect((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                       super_QAbstractScrollAreaPrivate.viewport);
    local_68._0_8_ = *(undefined8 *)(event + 0x10);
    unique0x1000030a = *(qreal *)(event + 0x18);
    local_98 = QPointF::toPoint((QPointF *)local_68);
    cVar7 = QRect::contains((QPoint *)&local_88,SUB81(&local_98,0));
    if (cVar7 != '\0') {
      local_88._0_8_ = *(QPoint *)(event + 0x10);
      local_88.i = *(quintptr *)(event + 0x18);
      QVar14 = QPointF::toPoint((QPointF *)&local_88);
      iVar10 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xd])(this);
      iVar10 = iVar10 + QVar14.xp.m_i.m_i;
      iVar11 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xe])(this);
      iVar11 = iVar11 + QVar14.yp.m_i.m_i;
      this_00 = (this->super_QCommonListViewBase).dd;
      iVar16 = this_00->space;
      local_68._4_4_ = iVar11 - iVar16;
      local_68._0_4_ = iVar10 - iVar16;
      stack0xffffffffffffffa0 = (qreal)CONCAT44(iVar11 + iVar16,iVar10 + iVar16);
      local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QListViewPrivate::intersectingSet
                ((QList<QModelIndex> *)&local_88,this_00,(QRect *)local_68,true);
      if (local_88.m.ptr == (QAbstractItemModel *)0x0) {
        local_98.xp.m_i = 0;
        local_98.yp.m_i = 0;
        pQStack_90 = (QAbstractItemModel *)0x0;
        local_58.yp.m_i = -1;
        local_58.xp.m_i = local_58.yp.m_i;
      }
      else {
        local_58.yp.m_i = ((QModelIndex *)(local_88.i + (local_88.m.ptr + -1) * 0x18))->c;
        local_98 = (QPoint)((QModelIndex *)(local_88.i + (local_88.m.ptr + -1) * 0x18))->i;
        pQStack_90 = (((QModelIndex *)(local_88.i + (local_88.m.ptr + -1) * 0x18))->m).ptr;
        local_58.xp.m_i = ((QModelIndex *)(local_88.i + (local_88.m.ptr + -1) * 0x18))->r;
      }
      QStack_50 = local_98;
      tStack_48.ptr = pQStack_90;
      if (((local_58.xp.m_i < 0) || (local_58.yp.m_i < 0)) ||
         (pQStack_90 == (QAbstractItemModel *)0x0)) {
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_58,
                   &(((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).root);
      }
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                ((QArrayDataPointer<QModelIndex> *)&local_88);
    }
    uVar12 = (**(code **)(*(long *)(((this->super_QCommonListViewBase).dd)->
                                   super_QAbstractItemViewPrivate).model + 0xe8))();
    QVar3._8_8_ = stack0xffffffffffffffa0;
    QVar3.x1.m_i = local_68._0_4_;
    QVar3.y1.m_i = local_68._4_4_;
    if ((*(uint *)(event + 0x2c) & uVar12) != 0) {
      iVar16 = -1;
      bVar8 = ::operator!=((QModelIndex *)&local_58,
                           &(((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate)
                            .root);
      QVar2._8_8_ = stack0xffffffffffffffa0;
      QVar2.x1.m_i = local_68._0_4_;
      QVar2.y1.m_i = local_68._4_4_;
      RVar15.m_i = iVar16;
      if (bVar8) {
        local_88._0_16_ = *(QRect *)(event + 0x10);
        local_98 = QPointF::toPoint((QPointF *)&local_88);
        pQVar1 = (this->super_QCommonListViewBase).qq;
        _local_68 = (QRect)(**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).
                                                  super_QAbstractScrollArea.super_QFrame.
                                                  super_QWidget + 0x1e0))
                                     (pQVar1,(QModelIndex *)&local_58);
        DVar13 = position(this,&local_98,(QRect *)local_68,(QModelIndex *)&local_58);
        (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
        dropIndicatorPosition = DVar13;
        RVar5.m_i = local_58.yp.m_i;
        if (DVar13 == BelowItem) {
          RVar6.m_i = local_58.xp.m_i + 1;
        }
        else {
          RVar6.m_i = local_58.xp.m_i;
          QVar2 = _local_68;
          if (DVar13 != AboveItem) goto LAB_00516586;
        }
        iVar16 = RVar6.m_i;
        QModelIndex::parent(&local_88,(QModelIndex *)&local_58);
        auVar4 = (undefined1  [16])local_88._0_16_;
        tStack_48.ptr = local_88.m.ptr;
        local_58.xp.m_i = local_88.r;
        local_58.yp.m_i = local_88.c;
        QStack_50.xp.m_i = (undefined4)local_88.i;
        QStack_50.yp.m_i = local_88.i._4_4_;
        RVar15.m_i = RVar5.m_i;
        local_88._0_16_ = auVar4;
        QVar2 = _local_68;
      }
      else {
        (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
        dropIndicatorPosition = OnViewport;
      }
LAB_00516586:
      (dropIndex->m).ptr = tStack_48.ptr;
      dropIndex->r = local_58.xp.m_i;
      dropIndex->c = local_58.yp.m_i;
      dropIndex->i = (quintptr)QStack_50;
      *dropRow = iVar16;
      *dropCol = RVar15.m_i;
      _local_68 = QVar2;
      bVar8 = QAbstractItemViewPrivate::droppingOnItself
                        (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                         event,(QModelIndex *)&local_58);
      bVar9 = true;
      QVar3 = _local_68;
      if (!bVar8) goto LAB_005165c4;
    }
  }
  bVar9 = false;
LAB_005165c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    _local_68 = QVar3;
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QListModeViewBase::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    if (event->isAccepted())
        return false;

    QModelIndex index;
    if (dd->viewport->rect().contains(event->position().toPoint())) {
        // can't use indexAt, doesn't account for spacing.
        QPoint p = event->position().toPoint();
        QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
        rect.adjust(-dd->spacing(), -dd->spacing(), dd->spacing(), dd->spacing());
        const QList<QModelIndex> intersectVector = dd->intersectingSet(rect);
        index = intersectVector.size() > 0
            ? intersectVector.last() : QModelIndex();
        if (!index.isValid())
            index = dd->root;
    }

    // If we are allowed to do the drop
    if (dd->model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != dd->root) {
            dd->dropIndicatorPosition = position(event->position().toPoint(), qq->visualRect(index), index);
            switch (dd->dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dd->dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!dd->droppingOnItself(event, index))
            return true;
    }
    return false;
}